

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample03.cpp
# Opt level: O2

PyObject * PyInit_sample03(void)

{
  class_<Person,std::shared_ptr<Person>> *this;
  class_<Person,_std::shared_ptr<Person>_> person;
  class_<Job,_std::shared_ptr<Job>_> job;
  module m;
  class_<Person,_std::shared_ptr<Person>_> cStack_58;
  class_<Job,_std::shared_ptr<Job>_> local_50;
  cpp_function local_48;
  cpp_function local_40;
  handle local_38;
  cpp_function local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  
  pybind11::module::module((module *)&local_38,"sample03","pybind11 module sample.");
  pybind11::class_<Job,_std::shared_ptr<Job>_>::class_<>(&local_50,local_38,"Job");
  pybind11::detail::init<>::execute<pybind11::class_<Job,_std::shared_ptr<Job>_>,_0>(&local_50);
  local_20 = Job::GetName_abi_cxx11_;
  local_18 = 0;
  pybind11::cpp_function::cpp_function<void,Job,std::__cxx11::string_const&>(&local_30,0x106338);
  pybind11::class_<Job,std::shared_ptr<Job>>::def_property<std::__cxx11::string(Job::*)()const>
            ((class_<Job,std::shared_ptr<Job>> *)&local_50,"name",(offset_in_Job_to_subr *)&local_20
             ,&local_30);
  pybind11::object::~object((object *)&local_30);
  pybind11::class_<Person,_std::shared_ptr<Person>_>::class_<>(&cStack_58,local_38,"Person");
  pybind11::detail::init<>::execute<pybind11::class_<Person,_std::shared_ptr<Person>_>,_0>
            (&cStack_58);
  local_20 = Person::GetName_abi_cxx11_;
  local_18 = 0;
  pybind11::cpp_function::cpp_function<void,Person,std::__cxx11::string_const&>(&local_40,0x106498);
  this = (class_<Person,std::shared_ptr<Person>> *)
         pybind11::class_<Person,std::shared_ptr<Person>>::
         def_property<std::__cxx11::string(Person::*)()const>
                   ((class_<Person,std::shared_ptr<Person>> *)&cStack_58,"name",
                    (offset_in_Job_to_subr *)&local_20,&local_40);
  local_30.super_function.super_object.super_handle.m_ptr = (function)Person::GetJob;
  local_28 = 0;
  pybind11::cpp_function::cpp_function<void,Person,std::shared_ptr<Job>const&>(&local_48,0x106564);
  pybind11::class_<Person,std::shared_ptr<Person>>::
  def_property<std::shared_ptr<Job>(Person::*)()const>
            (this,"job",(offset_in_Job_to_subr *)&local_30,&local_48);
  pybind11::object::~object((object *)&local_48);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object((object *)&cStack_58);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object((object *)&local_38);
  return local_38.m_ptr;
}

Assistant:

PyMODINIT_FUNC PyInit_sample03() {
	py::module m("sample03", "pybind11 module sample.");

	py::class_<Job, std::shared_ptr<Job>> job(m, "Job");
	job.def(py::init<>()).def_property("name", &Job::GetName, &Job::SetName);

	py::class_<Person, std::shared_ptr<Person>> person(m, "Person");
	person.def(py::init<>())
		.def_property("name", &Person::GetName, &Person::SetName)
		.def_property("job", &Person::GetJob, &Person::SetJob);

	return m.ptr();
}